

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<unsigned_long,unsigned_long,unsigned_long,duckdb::BinaryStandardOperatorWrapper,duckdb::DecimalSubtractOverflowCheck,bool>
               (unsigned_long *ldata,unsigned_long *rdata,unsigned_long *result_data,
               SelectionVector *lsel,SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,
               ValidityMask *rvalidity,ValidityMask *result_validity,bool fun)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  InternalException *pIVar5;
  ulong uVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  _Head_base<0UL,_unsigned_long_*,_false> _Var8;
  ulong uVar9;
  sel_t *psVar10;
  sel_t *psVar11;
  idx_t idx_in_entry;
  ulong uVar12;
  unsigned_long local_70;
  string local_68;
  buffer_ptr<ValidityBuffer> *local_48;
  sel_t *local_40;
  sel_t *local_38;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      local_70 = 0x29;
      local_68._M_dataplus._M_p =
           (pointer)::std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_70);
      local_68.field_2._M_allocated_capacity = local_70;
      builtin_strncpy(local_68._M_dataplus._M_p,"Unimplemented type for TryDecimalSubtract",0x29);
      local_68._M_string_length = local_70;
      local_68._M_dataplus._M_p[local_70] = '\0';
      InternalException::InternalException(pIVar5,&local_68);
      __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else if (count != 0) {
    psVar11 = lsel->sel_vector;
    psVar10 = rsel->sel_vector;
    local_48 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar12 = 0;
    local_40 = psVar10;
    local_38 = psVar11;
    do {
      uVar9 = uVar12;
      if (psVar11 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar11[uVar12];
      }
      uVar6 = uVar12;
      if (psVar10 != (sel_t *)0x0) {
        uVar6 = (ulong)psVar10[uVar12];
      }
      puVar1 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0)) {
        puVar1 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
LAB_01086948:
          pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          local_70 = 0x29;
          local_68._M_dataplus._M_p =
               (pointer)::std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_70);
          local_68.field_2._M_allocated_capacity = local_70;
          builtin_strncpy(local_68._M_dataplus._M_p,"Unimplemented type for TryDecimalSubtract",0x29
                         );
          local_68._M_string_length = local_70;
          local_68._M_dataplus._M_p[local_70] = '\0';
          InternalException::InternalException(pIVar5,&local_68);
          __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((puVar1[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0) goto LAB_01086948;
      }
      _Var8._M_head_impl =
           (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (_Var8._M_head_impl == (unsigned_long *)0x0) {
        local_70 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)&local_68,&local_70);
        sVar4 = local_68._M_string_length;
        _Var3._M_p = local_68._M_dataplus._M_p;
        local_68._M_dataplus._M_p = (pointer)0x0;
        local_68._M_string_length = 0;
        this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
        (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)_Var3._M_p;
        (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
          }
        }
        pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                           (local_48);
        _Var8._M_head_impl =
             (pTVar7->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
             _Var8._M_head_impl;
        psVar10 = local_40;
        psVar11 = local_38;
      }
      bVar2 = (byte)uVar12 & 0x3f;
      _Var8._M_head_impl[uVar12 >> 6] =
           _Var8._M_head_impl[uVar12 >> 6] & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
      uVar12 = uVar12 + 1;
    } while (count != uVar12);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}